

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.c
# Opt level: O1

sexp simplify(sexp ctx,sexp ast,sexp init_substs,sexp lambda)

{
  long lVar1;
  sexp psVar2;
  sexp psVar3;
  sexp psVar4;
  sexp psVar5;
  sexp psVar6;
  sexp psVar7;
  sexp ls1;
  sexp psVar8;
  sexp app;
  sexp res;
  sexp tmp;
  sexp substs;
  sexp ctx2;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  undefined1 local_b0 [16];
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [8];
  undefined8 uStack_40;
  
  local_a0 = (undefined1  [8])&DAT_0000043e;
  local_b0._0_8_ = &DAT_0000043e;
  local_98._8_8_ = 0x43e;
  if (((ulong)ast & 3) != 0) {
    return ast;
  }
  local_88._0_8_ = local_b0 + 8;
  uStack_40 = local_88;
  local_88._8_8_ = (ctx->value).context.saves;
  (ctx->value).context.saves = (sexp_gc_var_t *)uStack_40;
  local_48 = (undefined1  [8])local_98;
  local_68._24_8_ = local_48;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_68._24_8_;
  local_68._8_8_ = local_68 + 0x10;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_68._8_8_;
  local_68._0_8_ = local_b0;
  local_88._24_8_ = local_68;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_88._24_8_;
  local_88._16_8_ = local_98 + 8;
  (ctx->value).context.saves = (sexp_gc_var_t *)(local_88 + 0x10);
  psVar2 = ast;
  local_b0._8_8_ = ast;
  local_98._0_8_ = init_substs;
  local_68._16_8_ = (sexp)local_a0;
  switch(ast->tag) {
  case 0x1c:
    psVar2 = (ast->value).type.slots;
    lambda = ast;
LAB_0012da89:
    psVar2 = simplify(ctx,psVar2,(sexp)local_98._0_8_,lambda);
    (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).slots = psVar2;
    psVar2 = (sexp)local_b0._8_8_;
    break;
  case 0x1d:
    local_a0 = (undefined1  [8])simplify(ctx,(ast->value).type.name,init_substs,lambda);
    psVar2 = (sexp)local_a0;
    if (((ulong)local_a0 & 3) == 0) {
      if ((((ulong)local_a0 & 3) == 0) && (((sexp)local_a0)->tag != 0x22)) {
        (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).name =
             (sexp)local_a0;
        psVar2 = simplify(ctx,(((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->
                              type).cpl,(sexp)local_98._0_8_,lambda);
        (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).cpl = psVar2;
        psVar2 = (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).slots;
        goto LAB_0012da89;
      }
      if (((ulong)local_a0 & 3) == 0) {
        psVar2 = (sexp)local_a0;
        if (((sexp)local_a0)->tag == 0x22) {
          psVar2 = (sexp)&((sexp)local_a0)->value;
        }
      }
    }
    lVar1._0_4_ = psVar2->tag;
    lVar1._4_1_ = psVar2->markedp;
    lVar1._5_3_ = *(undefined3 *)&psVar2->field_0x5;
    local_b0._8_8_ = *(undefined8 *)((long)(local_b0._8_8_ + 8) + (ulong)(lVar1 == 0x3e) * 8 + 8);
    psVar2 = simplify(ctx,(sexp)local_b0._8_8_,(sexp)local_98._0_8_,lambda);
    break;
  case 0x1e:
    while( true ) {
      psVar2 = ast;
      if ((((ulong)init_substs & 3) != 0) || (psVar2 = ast, init_substs->tag != 6))
      goto switchD_0012da7d_caseD_20;
      psVar2 = (init_substs->value).type.name;
      if (((psVar2->value).type.name == (ast->value).type.name) &&
         (psVar2 = (psVar2->value).type.cpl,
         (psVar2->value).type.name == (((ast->value).type.cpl)->value).type.cpl)) break;
      init_substs = (init_substs->value).type.cpl;
    }
    psVar2 = (psVar2->value).type.cpl;
    break;
  case 0x1f:
    psVar2 = simplify(ctx,(ast->value).type.cpl,init_substs,lambda);
    (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).cpl = psVar2;
    psVar2 = (sexp)local_b0._8_8_;
    break;
  case 0x20:
    break;
  case 0x21:
    local_b0._0_8_ = &DAT_0000023e;
    psVar2 = (ast->value).type.name;
    if (((ulong)psVar2 & 3) == 0) {
      do {
        if (psVar2->tag != 6) break;
        local_a0 = (undefined1  [8])
                   simplify(ctx,(psVar2->value).type.name,(sexp)local_98._0_8_,lambda);
        psVar3 = (psVar2->value).type.cpl;
        if (((((ulong)psVar3 & 3) != 0) || (psVar3->tag != 6)) ||
           ((((ulong)local_a0 & 3) == 0 &&
            (((((ulong)local_a0 & 3) == 0 && (((sexp)local_a0)->tag != 0x22)) &&
             ((((sexp)local_a0)->tag | 2) != 0x1e)))))) {
          sexp_push_op(ctx,(sexp_conflict *)local_b0,(sexp)local_a0);
        }
        psVar2 = (psVar2->value).type.cpl;
      } while (((ulong)psVar2 & 3) == 0);
    }
    if ((((local_b0._0_8_ & 3) == 0) && (*(sexp_tag_t *)local_b0._0_8_ == 6)) &&
       ((((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->type).cpl == (sexp)0x23e)
       ) {
      psVar2 = (sexp)((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->flonum;
    }
    else {
      psVar2 = sexp_nreverse_op(ctx,(sexp)0x0,1,(sexp)local_b0._0_8_);
      (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).name = psVar2;
      psVar2 = (sexp)local_b0._8_8_;
    }
    break;
  default:
    psVar2 = ast;
    if (ast->tag == 6) {
      psVar2 = (ast->value).type.name;
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x1c)) {
        psVar2 = simplify(ctx,psVar2,init_substs,lambda);
        local_a0 = (undefined1  [8])psVar2;
      }
      local_b0._0_8_ = sexp_cons_op(ctx,(sexp)0x0,2,psVar2,(sexp)&DAT_0000023e);
      (((sexp)local_b0._0_8_)->value).type.slots =
           (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).slots;
      psVar2 = (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._8_8_ + 8))->type).cpl;
      if (((ulong)psVar2 & 3) == 0) {
        do {
          if (psVar2->tag != 6) break;
          local_a0 = (undefined1  [8])
                     simplify(ctx,(psVar2->value).type.name,(sexp)local_98._0_8_,lambda);
          sexp_push_op(ctx,(sexp_conflict *)local_b0,(sexp)local_a0);
          if (((local_b0._0_8_ & 3) == 0) && (*(sexp_tag_t *)local_b0._0_8_ == 6)) {
            (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->type).slots =
                 (psVar2->value).type.slots;
          }
          psVar2 = (psVar2->value).type.cpl;
        } while (((ulong)psVar2 & 3) == 0);
      }
      psVar2 = sexp_nreverse_op(ctx,(sexp)0x0,1,(sexp)local_b0._0_8_);
      psVar3 = (psVar2->value).type.name;
      local_b0._0_8_ = psVar2;
      if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 0x1b)) {
        if ((psVar3->value).flonum_bits[0x58] == '\x04') {
          for (psVar3 = (psVar2->value).type.cpl; (((ulong)psVar3 & 3) == 0 && (psVar3->tag == 6));
              psVar3 = (psVar3->value).type.cpl) {
            psVar8 = (psVar3->value).type.name;
            if ((((ulong)psVar8 & 3) == 0) && (psVar8->tag != 0x22)) goto switchD_0012da7d_caseD_20;
          }
          local_98._8_8_ = sexp_make_eval_context(ctx,(sexp)0x0,(ctx->value).type.cpl,0,0);
          sexp_generate((sexp_conflict)local_98._8_8_,(sexp_conflict)0x0,(sexp_conflict)0x0,
                        (sexp_conflict)0x0,(sexp_conflict)local_b0._0_8_);
          local_b0._8_8_ = sexp_complete_bytecode((sexp)local_98._8_8_);
          if (((local_b0._8_8_ & 3) != 0) ||
             (psVar2 = (sexp)local_b0._0_8_, ((sexp)local_b0._8_8_)->tag != 0x13)) {
            local_a0 = (undefined1  [8])
                       sexp_make_vector_op((sexp)local_98._8_8_,(sexp)0x0,2,(sexp)0x0,
                                           (sexp)&DAT_0000043e);
            local_a0 = (undefined1  [8])
                       sexp_make_procedure_op
                                 ((sexp)local_98._8_8_,(sexp)0x0,4,(sexp)&DAT_00000001,
                                  (sexp)&DAT_00000001,(sexp)local_b0._8_8_,(sexp)local_a0);
            if (((((ulong)local_a0 & 3) != 0) ||
                (psVar2 = (sexp)local_b0._0_8_, ((sexp)local_a0)->tag != 0x13)) &&
               ((local_a0 = (undefined1  [8])
                            sexp_apply_no_err_handler
                                      ((sexp_conflict)local_98._8_8_,(sexp_conflict)local_a0,
                                       (sexp_conflict)&DAT_0000023e), ((ulong)local_a0 & 3) != 0 ||
                (psVar2 = (sexp)local_b0._0_8_, ((sexp_conflict)local_a0)->tag != 0x13)))) {
              psVar2 = sexp_make_lit((sexp)local_98._8_8_,(sexp)local_a0);
            }
          }
        }
      }
      else if ((lambda != (sexp)0x0) && ((((ulong)psVar3 & 3) == 0 && (psVar3->tag == 0x1c)))) {
        psVar8 = (psVar3->value).type.cpl;
        psVar3 = (psVar3->value).type.dl;
        ls1 = (psVar2->value).type.cpl;
        psVar4 = sexp_length_op(ctx,(sexp)0x0,1,psVar8);
        psVar5 = sexp_length_op(ctx,(sexp)0x0,1,ls1);
        if (psVar4 == psVar5) {
          if (((ulong)ls1 & 3) == 0) {
            psVar4 = (sexp)0x0;
            do {
              if (ls1->tag != 6) break;
              psVar6 = sexp_memq_op(ctx,(sexp)0x0,2,(psVar8->value).type.name,psVar3);
              psVar5 = psVar8;
              psVar7 = ls1;
              if ((psVar6 == (sexp)&DAT_0000003e) &&
                 ((psVar6 = (ls1->value).type.name, ((ulong)psVar6 & 3) != 0 ||
                  (psVar6->tag == 0x22)))) {
                local_a0 = (undefined1  [8])
                           sexp_cons_op(ctx,(sexp)0x0,2,
                                        (((anon_union_24768_35_b8e82fc1_for_value *)
                                         (local_b0._0_8_ + 8))->type).name,psVar6);
                local_a0 = (undefined1  [8])
                           sexp_cons_op(ctx,(sexp)0x0,2,(psVar8->value).type.name,(sexp)local_a0);
                sexp_push_op(ctx,(sexp_conflict *)local_98,(sexp)local_a0);
                (psVar2->value).type.cpl = (ls1->value).type.cpl;
                psVar5 = psVar4;
                if (psVar4 == (sexp)0x0) {
                  psVar5 = (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->type).
                           name;
                  psVar4 = (sexp)0x0;
                }
                (psVar5->value).type.cpl = (psVar8->value).type.cpl;
                psVar5 = psVar4;
                psVar7 = psVar2;
              }
              ls1 = (ls1->value).type.cpl;
              psVar8 = (psVar8->value).type.cpl;
              psVar4 = psVar5;
              psVar2 = psVar7;
            } while (((ulong)ls1 & 3) == 0);
          }
          psVar3 = (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->type).name;
        }
        else {
          psVar3 = (((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->type).name;
          psVar2 = (sexp)local_b0._0_8_;
          if ((((ulong)psVar3 & 3) != 0) || (psVar2 = (sexp)local_b0._0_8_, psVar3->tag != 0x1c))
          break;
        }
        psVar2 = simplify(ctx,(psVar3->value).type.slots,(sexp)local_98._0_8_,psVar3);
        (((((anon_union_24768_35_b8e82fc1_for_value *)(local_b0._0_8_ + 8))->type).name)->value).
        type.slots = psVar2;
        psVar2 = (sexp)local_b0._0_8_;
      }
    }
  }
switchD_0012da7d_caseD_20:
  local_b0._8_8_ = psVar2;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_88._8_8_;
  return (sexp)local_b0._8_8_;
}

Assistant:

static sexp simplify (sexp ctx, sexp ast, sexp init_substs, sexp lambda) {
  int check;
  sexp ls1, ls2, p1, p2, sv;
  sexp_gc_var5(res, substs, tmp, app, ctx2);
  if (!sexp_pointerp(ast))
    return ast;
  sexp_gc_preserve5(ctx, res, substs, tmp, app, ctx2);
  res = ast;                    /* return the ast as-is by default */
  substs = init_substs;

  switch (sexp_pointer_tag(res)) {

  case SEXP_PAIR:
    /* don't simplify the operator if it's a lambda because we
       simplify that as a special case below, with the appropriate
       substs list */
    app = sexp_list1(ctx, sexp_lambdap(sexp_car(res)) ? sexp_car(res)
                     : (tmp=simplify(ctx, sexp_car(res), substs, lambda)));
    sexp_pair_source(app) = sexp_pair_source(res);
    for (ls1=sexp_cdr(res); sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
      sexp_push(ctx, app, tmp=simplify(ctx, sexp_car(ls1), substs, lambda));
      if (sexp_pairp(app)) sexp_pair_source(app) = sexp_pair_source(ls1);
    }
    app = sexp_nreverse(ctx, app);
    /* app now holds a copy of the list, and is the default result
       (res = app below) if we don't replace it with a simplification */
    if (sexp_opcodep(sexp_car(app))) {
      /* opcode app - right now we just constant fold arithmetic */
      if (sexp_opcode_class(sexp_car(app)) == SEXP_OPC_ARITHMETIC) {
        for (check=1, ls1=sexp_cdr(app); sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
          if (sexp_pointerp(sexp_car(ls1)) && ! sexp_litp(sexp_car(ls1))) {
            check = 0;
            break;
          }
        }
        if (check) {
          ctx2 = sexp_make_eval_context(ctx, NULL, sexp_context_env(ctx), 0, 0);
          sexp_generate(ctx2, 0, 0, 0, app);
          res = sexp_complete_bytecode(ctx2);
          if (! sexp_exceptionp(res)) {
            tmp = sexp_make_vector(ctx2, 0, SEXP_VOID);
            tmp = sexp_make_procedure(ctx2, SEXP_ZERO, SEXP_ZERO, res, tmp);
            if (! sexp_exceptionp(tmp)) {
              tmp = sexp_apply_no_err_handler(ctx2, tmp, SEXP_NULL);
              if (! sexp_exceptionp(tmp))
                app = sexp_make_lit(ctx2, tmp);
            }
          }
        }
      }
    } else if (lambda && sexp_lambdap(sexp_car(app))) { /* let */
      p1 = NULL;
      p2 = sexp_lambda_params(sexp_car(app));
      ls1 = app;
      ls2 = sexp_cdr(app);
      sv = sexp_lambda_sv(sexp_car(app));
      /* inline constants and immutable references */
      if (sexp_length(ctx, p2) == sexp_length(ctx, ls2)) {
        for ( ; sexp_pairp(ls2); ls2=sexp_cdr(ls2), p2=sexp_cdr(p2)) {
          if (sexp_not(sexp_memq(ctx, sexp_car(p2), sv))
              && (! sexp_pointerp(sexp_car(ls2)) || sexp_litp(sexp_car(ls2))
                  /* disable inline references for now */
                  || (0 && sexp_refp(sexp_car(ls2))
                      && sexp_lambdap(sexp_ref_loc(sexp_car(ls2)))
                      && sexp_not(sexp_memq(ctx, sexp_ref_name(sexp_car(ls2)),
                                            sexp_lambda_sv(sexp_ref_loc(sexp_car(ls2)))))))) {
            tmp = sexp_cons(ctx, sexp_car(app), sexp_car(ls2));
            tmp = sexp_cons(ctx, sexp_car(p2), tmp);
            sexp_push(ctx, substs, tmp);
            sexp_cdr(ls1) = sexp_cdr(ls2);
            if (p1)
              sexp_cdr(p1) = sexp_cdr(p2);
            else
              sexp_lambda_params(sexp_car(app)) = sexp_cdr(p2);
          } else {
            p1 = p2;
            ls1 = ls2;
          }
        }
        sexp_lambda_body(sexp_car(app))
          = simplify(ctx, sexp_lambda_body(sexp_car(app)), substs, sexp_car(app));
        /* TODO: Revisit this - it causes GC problems in rare cases. */
        /* if (sexp_nullp(sexp_cdr(app)) */
        /*     && sexp_nullp(sexp_lambda_params(sexp_car(app))) */
        /*     && sexp_nullp(sexp_lambda_defs(sexp_car(app)))) */
        /*   app = sexp_lambda_body(sexp_car(app)); */
      } else if (sexp_lambdap(sexp_car(app))) {
        sexp_lambda_body(sexp_car(app))
          = simplify(ctx, sexp_lambda_body(sexp_car(app)), substs, sexp_car(app));
      }
    }
    res = app;
    break;

  case SEXP_LAMBDA:
    sexp_lambda_body(res) = simplify(ctx, sexp_lambda_body(res), substs, res);
    break;

  case SEXP_CND:
    tmp = simplify(ctx, sexp_cnd_test(res), substs, lambda);
    if (sexp_litp(tmp) || ! sexp_pointerp(tmp)) {
      res = sexp_not((sexp_litp(tmp) ? sexp_lit_value(tmp) : tmp))
        ? sexp_cnd_fail(res) : sexp_cnd_pass(res);
      res = simplify(ctx, res, substs, lambda);
    } else {
      sexp_cnd_test(res) = tmp;
      simplify_it(sexp_cnd_pass(res));
      simplify_it(sexp_cnd_fail(res));
    }
    break;

  case SEXP_REF:
    tmp = sexp_ref_name(res);
    for (ls1=substs; sexp_pairp(ls1); ls1=sexp_cdr(ls1))
      if ((sexp_caar(ls1) == tmp) && (sexp_cadar(ls1) == sexp_ref_loc(res))) {
        res = sexp_cddar(ls1);
        break;
      }
    break;

  case SEXP_SET:
    simplify_it(sexp_set_value(res));
    break;

  case SEXP_SEQ:
    app = SEXP_NULL;
    for (ls2=sexp_seq_ls(res); sexp_pairp(ls2); ls2=sexp_cdr(ls2)) {
      tmp = simplify(ctx, sexp_car(ls2), substs, lambda);
      if (! (sexp_pairp(sexp_cdr(ls2))
             && (sexp_litp(tmp) || ! sexp_pointerp(tmp) || sexp_refp(tmp)
                 || sexp_lambdap(tmp))))
        sexp_push(ctx, app, tmp);
    }
    if (sexp_pairp(app) && sexp_nullp(sexp_cdr(app)))
      res = sexp_car(app);
    else
      sexp_seq_ls(res) = sexp_nreverse(ctx, app);
    break;

  }

  sexp_gc_release5(ctx);
  return res;
}